

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O2

void __thiscall
BayesianGameCollaborativeGraphical::SetProbabilityDistribution
          (BayesianGameCollaborativeGraphical *this,PDDiscreteInterface *pd)

{
  value_type this_00;
  PDDiscreteInterface *pPVar1;
  reference ppBVar2;
  size_t sVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  Index jtI_e;
  Index jTypeI;
  ulong uVar5;
  uint uVar6;
  double p;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_48;
  
  pPVar1 = (PDDiscreteInterface *)(**(code **)(*(long *)pd + 0x40))(pd);
  this->_m_jt_pd = pPVar1;
  (**(code **)(*(long *)pPVar1 + 0x38))(pPVar1);
  for (uVar6 = 0; uVar5 = (ulong)uVar6, uVar5 < this->_m_nrLRFs; uVar6 = uVar6 + 1) {
    ppBVar2 = std::
              vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
              ::at(&this->_m_LRFs,uVar5);
    this_00 = *ppBVar2;
    (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0x16])(&_Stack_48,this,uVar5);
    uVar5 = 0;
    while( true ) {
      sVar3 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)this_00);
      jTypeI = (Index)uVar5;
      if (sVar3 <= uVar5) break;
      pvVar4 = BayesianGameBase::JointToIndividualTypeIndices((BayesianGameBase *)this_00,jTypeI);
      p = (double)(**(code **)(*(long *)this->_m_jt_pd + 0x20))(this->_m_jt_pd,&_Stack_48,pvVar4);
      BayesianGameBase::SetProbability((BayesianGameBase *)this_00,jTypeI,p);
      uVar5 = (ulong)(jTypeI + 1);
    }
    (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0xf])(this_00);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_48);
  }
  return;
}

Assistant:

void BayesianGameCollaborativeGraphical::
SetProbabilityDistribution(const PDDiscreteInterface* pd)
{
    //first create a clone of the pd
    _m_jt_pd = pd->Clone(); 

    _m_jt_pd->SanityCheck();
    //next make sure that all the edges use consistent probs

    for(Index e = 0; e < _m_nrLRFs; e++)
    {   
        BayesianGameIdenticalPayoff& edge(*(_m_LRFs.at(e)) );
        const Scope& sc_e = GetScope(e);

        for(Index jtI_e=0; jtI_e < edge.GetNrJointTypes(); jtI_e++)
        {
            const vector<Index>& indTypes_e = edge.JointToIndividualTypeIndices(jtI_e);
            double p = _m_jt_pd->Get( sc_e, indTypes_e);
            edge.SetProbability(jtI_e, p);
        }
        edge.SanityCheck();
    }
    
}